

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void jessilib::config::write_object
               (object *in_object,path *in_filename,string *in_format,text_encoding in_encoding)

{
  file_error *this;
  string sStack_248;
  ofstream file;
  byte abStack_208 [480];
  
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)&file,in_filename,_S_out|_S_bin);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    get_format(&sStack_248,in_filename,in_format);
    serialize_object((ostream *)&file,in_object,&sStack_248,in_encoding);
    std::__cxx11::string::~string((string *)&sStack_248);
    std::ofstream::~ofstream(&file);
    return;
  }
  this = (file_error *)__cxa_allocate_exception(0x10);
  file_error::file_error(this,in_filename);
  __cxa_throw(this,&file_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void config::write_object(const object& in_object, const std::filesystem::path& in_filename, const std::string& in_format, text_encoding in_encoding) {
	// Open up file for writing
	std::ofstream file{ in_filename, std::ios::out | std::ios::binary };
	if (!file) {
		// Failed to open the file; throw file_error
		throw file_error( in_filename );
	}

	// Deserialize1
	return serialize_object(file, in_object, get_format(in_filename, in_format), in_encoding);
}